

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrap_opkill.cpp
# Opt level: O0

uint32_t __thiscall spvtools::opt::WrapOpKill::GetVoidTypeId(WrapOpKill *this)

{
  uint32_t uVar1;
  IRContext *this_00;
  undefined1 local_48 [8];
  Void void_type;
  TypeManager *type_mgr;
  WrapOpKill *this_local;
  
  if (*(int *)&(this->super_Pass).field_0x34 == 0) {
    this_00 = Pass::context(&this->super_Pass);
    void_type.super_Type._32_8_ = IRContext::get_type_mgr(this_00);
    analysis::Void::Void((Void *)local_48);
    uVar1 = analysis::TypeManager::GetTypeInstruction
                      ((TypeManager *)void_type.super_Type._32_8_,(Type *)local_48);
    *(uint32_t *)&(this->super_Pass).field_0x34 = uVar1;
    this_local._4_4_ = *(uint32_t *)&(this->super_Pass).field_0x34;
    analysis::Void::~Void((Void *)local_48);
  }
  else {
    this_local._4_4_ = *(uint32_t *)&(this->super_Pass).field_0x34;
  }
  return this_local._4_4_;
}

Assistant:

uint32_t WrapOpKill::GetVoidTypeId() {
  if (void_type_id_ != 0) {
    return void_type_id_;
  }

  analysis::TypeManager* type_mgr = context()->get_type_mgr();
  analysis::Void void_type;
  void_type_id_ = type_mgr->GetTypeInstruction(&void_type);
  return void_type_id_;
}